

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_swap_tet_pass(REF_GRID ref_grid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_NODE ref_node_00;
  REF_STATUS RVar4;
  uint uVar5;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT others [12] [3];
  int local_e0;
  REF_INT other;
  REF_INT n2;
  REF_INT n1;
  REF_INT n0;
  REF_INT degree;
  REF_BOOL allowed;
  REF_CAVITY ref_cavity;
  double dStack_b8;
  REF_INT best_other;
  REF_DBL best;
  REF_DBL min_add;
  REF_DBL min_del;
  REF_DBL quality;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  unique0x00012000 = ref_grid->cell[8];
  memcpy(&ref_private_macro_code_rss_1,&DAT_002b1be0,0x90);
  nodes[0x19] = 0;
  do {
    if (stack0xffffffffffffffd8->max <= nodes[0x19]) {
      return 0;
    }
    RVar4 = ref_cell_nodes(stack0xffffffffffffffd8,nodes[0x19],(REF_INT *)&quality);
    if (RVar4 == 0) {
      uVar5 = ref_node_tet_quality(ref_node_00,(REF_INT *)&quality,&min_del);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0xa50,"ref_cavity_swap_tet_pass",(ulong)uVar5,"qual");
        return uVar5;
      }
      if (min_del < ref_grid->adapt->swap_min_quality) {
        ref_cavity._4_4_ = -1;
        dStack_b8 = -2.0;
        for (local_e0 = 0; local_e0 < 0xc; local_e0 = local_e0 + 1) {
          iVar1 = (&ref_private_macro_code_rss_1)[(long)local_e0 * 3];
          iVar2 = others[(long)local_e0 + -1][2];
          iVar3 = others[local_e0][0];
          uVar5 = ref_cavity_mixed(ref_grid,nodes[(long)iVar1 + -2],nodes[(long)iVar2 + -2],&n0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xa59,"ref_cavity_swap_tet_pass",(ulong)uVar5,"mixed");
            return uVar5;
          }
          if (n0 != 0) {
            uVar5 = ref_cell_local_gem(stack0xffffffffffffffd8,ref_node_00,nodes[(long)iVar1 + -2],
                                       nodes[(long)iVar2 + -2],&n0);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xa5d,"ref_cavity_swap_tet_pass",(ulong)uVar5,"local gem");
              return uVar5;
            }
            if (n0 != 0) {
              uVar5 = ref_cavity_edge_swap_boundary
                                (ref_grid,nodes[(long)iVar1 + -2],nodes[(long)iVar2 + -2],&n0);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0xa61,"ref_cavity_swap_tet_pass",(ulong)uVar5,"surface geom and topo");
                return uVar5;
              }
              if (n0 != 0) {
                uVar5 = ref_cell_degree_with2
                                  (stack0xffffffffffffffd8,nodes[(long)iVar1 + -2],
                                   nodes[(long)iVar2 + -2],&n1);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0xa64,"ref_cavity_swap_tet_pass",(ulong)uVar5,"edge degree");
                  return uVar5;
                }
                if (n1 <= ref_grid->adapt->swap_max_degree) {
                  uVar5 = ref_cavity_create((REF_CAVITY *)&degree);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0xa66,"ref_cavity_swap_tet_pass",(ulong)uVar5,"create");
                    return uVar5;
                  }
                  RVar4 = ref_cavity_form_edge_swap
                                    (_degree,ref_grid,nodes[(long)iVar1 + -2],
                                     nodes[(long)iVar2 + -2],nodes[(long)iVar3 + -2]);
                  if (RVar4 == 0) {
                    if (_degree->state == REF_CAVITY_INCONSISTENT) {
                      uVar5 = ref_cavity_free(_degree);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0xa70,"ref_cavity_swap_tet_pass",(ulong)uVar5,"free");
                        return uVar5;
                      }
                    }
                    else {
                      RVar4 = ref_cavity_check_visible(_degree);
                      if (RVar4 == 0) {
                        if (_degree->state == REF_CAVITY_VISIBLE) {
                          uVar5 = ref_cavity_ratio(_degree,&n0);
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,0xa79,"ref_cavity_swap_tet_pass",(ulong)uVar5,
                                   "post ratio limits");
                            return uVar5;
                          }
                          if (n0 == 0) {
                            uVar5 = ref_cavity_free(_degree);
                            if (uVar5 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                     ,0xa7b,"ref_cavity_swap_tet_pass",(ulong)uVar5,"free");
                              return uVar5;
                            }
                            goto LAB_001fc235;
                          }
                          uVar5 = ref_cavity_change(_degree,&min_add,&best);
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,0xa7e,"ref_cavity_swap_tet_pass",(ulong)uVar5,"change");
                            return uVar5;
                          }
                          if ((0.0001 < best - min_add) && (dStack_b8 < best)) {
                            dStack_b8 = best;
                            ref_cavity._4_4_ = local_e0;
                          }
                        }
                        uVar5 = ref_cavity_free(_degree);
                        if (uVar5 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0xa86,"ref_cavity_swap_tet_pass",(ulong)uVar5,"free");
                          return uVar5;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0xa74,"ref_cavity_swap_tet_pass","check visible");
                        uVar5 = ref_cavity_free(_degree);
                        if (uVar5 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0xa75,"ref_cavity_swap_tet_pass",(ulong)uVar5,"free");
                          return uVar5;
                        }
                      }
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0xa6a,"ref_cavity_swap_tet_pass","form edge swap");
                    uVar5 = ref_cavity_free(_degree);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0xa6b,"ref_cavity_swap_tet_pass",(ulong)uVar5,"free");
                      return uVar5;
                    }
                  }
                }
              }
            }
          }
LAB_001fc235:
        }
        if (ref_cavity._4_4_ != -1) {
          uVar5 = ref_cavity_create((REF_CAVITY *)&degree);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xa89,"ref_cavity_swap_tet_pass",(ulong)uVar5,"create");
            return uVar5;
          }
          uVar5 = ref_cavity_form_edge_swap
                            (_degree,ref_grid,
                             nodes[(long)(&ref_private_macro_code_rss_1)[(long)ref_cavity._4_4_ * 3]
                                   + -2],nodes[(long)others[(long)ref_cavity._4_4_ + -1][2] + -2],
                             nodes[(long)others[ref_cavity._4_4_][0] + -2]);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xa8f,"ref_cavity_swap_tet_pass",(ulong)uVar5,"cavity gem");
            return uVar5;
          }
          uVar5 = ref_cavity_check_visible(_degree);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xa90,"ref_cavity_swap_tet_pass",(ulong)uVar5,"enlarge viz");
            return uVar5;
          }
          if (_degree->debug != 0) {
            uVar5 = ref_cavity_change(_degree,&min_add,&best);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xa92,"ref_cavity_swap_tet_pass",(ulong)uVar5,"change");
              return uVar5;
            }
            printf("cavity accepted %f -> %f\n",min_add,best);
          }
          uVar5 = ref_cavity_replace(_degree);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xa95,"ref_cavity_swap_tet_pass",(ulong)uVar5,"replace");
            return uVar5;
          }
          uVar5 = ref_cavity_free(_degree);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xa96,"ref_cavity_swap_tet_pass",(ulong)uVar5,"free");
            return uVar5;
          }
        }
      }
    }
    nodes[0x19] = nodes[0x19] + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_swap_tet_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality, min_del, min_add, best;
  REF_INT best_other;
  REF_CAVITY ref_cavity;
  REF_BOOL allowed;
  REF_INT degree;
  REF_INT n0, n1, n2;
  REF_INT other;
  REF_INT others[12][3] = {
      {0, 1, 2}, {0, 1, 3}, {0, 2, 1}, {0, 2, 3}, {0, 3, 1}, {0, 3, 2},
      {1, 2, 0}, {1, 2, 3}, {1, 3, 0}, {1, 3, 2}, {2, 3, 0}, {2, 3, 1},
  };

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
    if (quality < ref_grid_adapt(ref_grid, swap_min_quality)) {
      best_other = REF_EMPTY;
      best = -2.0;
      for (other = 0; other < 12; other++) {
        n0 = others[other][0];
        n1 = others[other][1];
        n2 = others[other][2];
        RSS(ref_cavity_mixed(ref_grid, nodes[n0], nodes[n1], &allowed),
            "mixed");
        if (!allowed) continue;
        RSS(ref_cell_local_gem(ref_cell, ref_node, nodes[n0], nodes[n1],
                               &allowed),
            "local gem");
        if (!allowed) continue;
        RSS(ref_cavity_edge_swap_boundary(ref_grid, nodes[n0], nodes[n1],
                                          &allowed),
            "surface geom and topo");
        if (!allowed) continue;
        RSS(ref_cell_degree_with2(ref_cell, nodes[n0], nodes[n1], &degree),
            "edge degree");
        if (degree > ref_grid_adapt(ref_grid, swap_max_degree)) continue;
        RSS(ref_cavity_create(&ref_cavity), "create");
        if (REF_SUCCESS != ref_cavity_form_edge_swap(ref_cavity, ref_grid,
                                                     nodes[n0], nodes[n1],
                                                     nodes[n2])) {
          REF_WHERE("form edge swap"); /* note but skip cavity failures */
          RSS(ref_cavity_free(ref_cavity), "free");
          continue;
        }
        if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity)) {
          /* skip cavity failures */
          RSS(ref_cavity_free(ref_cavity), "free");
          continue;
        }
        if (REF_SUCCESS != ref_cavity_check_visible(ref_cavity)) {
          REF_WHERE("check visible"); /* note but skip cavity failures */
          RSS(ref_cavity_free(ref_cavity), "free");
          continue;
        }
        if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
          RSS(ref_cavity_ratio(ref_cavity, &allowed), "post ratio limits");
          if (!allowed) {
            RSS(ref_cavity_free(ref_cavity), "free");
            continue;
          }
          RSS(ref_cavity_change(ref_cavity, &min_del, &min_add), "change");
          if (min_add - min_del > 0.0001) {
            if (best < min_add) {
              best = min_add;
              best_other = other;
            }
          }
        }
        RSS(ref_cavity_free(ref_cavity), "free");
      }
      if (REF_EMPTY != best_other) {
        RSS(ref_cavity_create(&ref_cavity), "create");
        n0 = others[best_other][0];
        n1 = others[best_other][1];
        n2 = others[best_other][2];
        RSS(ref_cavity_form_edge_swap(ref_cavity, ref_grid, nodes[n0],
                                      nodes[n1], nodes[n2]),
            "cavity gem");
        RSS(ref_cavity_check_visible(ref_cavity), "enlarge viz");
        if (ref_cavity_debug(ref_cavity)) {
          RSS(ref_cavity_change(ref_cavity, &min_del, &min_add), "change");
          printf("cavity accepted %f -> %f\n", min_del, min_add);
        }
        RSS(ref_cavity_replace(ref_cavity), "replace");
        RSS(ref_cavity_free(ref_cavity), "free");
      }
    }
  }

  return REF_SUCCESS;
}